

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureFilterMinmaxTests.cpp
# Opt level: O0

void __thiscall
gl4cts::TextureFilterMinmaxParameterQueriesTestCase::testReductionModeQueries
          (TextureFilterMinmaxParameterQueriesTestCase *this,Functions *gl,GLint pname)

{
  glSamplerParameteriFunc p_Var1;
  SupportedTextureType *this_00;
  glTexParameterivFunc p_Var2;
  glTexParameterIivFunc p_Var3;
  glTextureParameterivFunc p_Var4;
  glTextureParameterIivFunc p_Var5;
  undefined8 context;
  bool bVar6;
  GLenum GVar7;
  deUint32 dVar8;
  TypedObjectWrapper<(glu::ObjectType)7> *this_01;
  ObjectWrapper *this_02;
  vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*>_>
  *pvVar9;
  reference ppSVar10;
  ContextInfo *this_03;
  vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>
  *pvVar11;
  pointer pSVar12;
  Texture2D *pTVar13;
  DefaultDeleter<glu::Texture2D> local_89;
  undefined1 local_88 [8];
  MovePtr<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_> texture;
  __normal_iterator<const_gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType_*,_std::vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>_>
  local_70;
  SupportedTextureDataTypeIter iter_1;
  bool is_arb_es31_compatibility;
  SupportedTextureType *textureType;
  __normal_iterator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*const_*,_std::vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*>_>_>
  local_50;
  SupportedTextureTypeIter iter;
  undefined1 local_38 [8];
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)7>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)7>_>_>
  sampler;
  RenderContext *renderContext;
  Functions *pFStack_18;
  GLint pname_local;
  Functions *gl_local;
  TextureFilterMinmaxParameterQueriesTestCase *this_local;
  
  renderContext._4_4_ = pname;
  pFStack_18 = gl;
  gl_local = (Functions *)this;
  sampler.
  super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)7>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)7>_>_>
  .m_data._8_8_ = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  this_01 = (TypedObjectWrapper<(glu::ObjectType)7> *)operator_new(0x18);
  glu::TypedObjectWrapper<(glu::ObjectType)7>::TypedObjectWrapper
            (this_01,(RenderContext *)
                     sampler.
                     super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)7>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)7>_>_>
                     .m_data._8_8_);
  de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)7>_>::DefaultDeleter
            ((DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)7>_> *)
             ((long)&iter._M_current + 3));
  de::details::
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)7>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)7>_>_>
  ::MovePtr((MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)7>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)7>_>_>
             *)local_38,this_01);
  GVar7 = (*pFStack_18->getError)();
  glu::checkError(GVar7,"glu::Sampler error occurred",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                  ,0x24e);
  p_Var1 = pFStack_18->samplerParameteri;
  this_02 = &de::details::
             UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)7>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)7>_>_>
             ::operator*((UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)7>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)7>_>_>
                          *)local_38)->super_ObjectWrapper;
  dVar8 = glu::ObjectWrapper::operator*(this_02);
  (*p_Var1)(dVar8,0x9366,renderContext._4_4_);
  GVar7 = (*pFStack_18->getError)();
  glu::checkError(GVar7,"samplerParameteri error occurred",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                  ,0x251);
  pvVar9 = TextureFilterMinmaxUtils::getSupportedTextureTypes(&this->m_utils);
  local_50._M_current =
       (SupportedTextureType **)
       std::
       vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*>_>
       ::begin(pvVar9);
  while( true ) {
    pvVar9 = TextureFilterMinmaxUtils::getSupportedTextureTypes(&this->m_utils);
    textureType = (SupportedTextureType *)
                  std::
                  vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*>_>
                  ::end(pvVar9);
    bVar6 = __gnu_cxx::operator!=
                      (&local_50,
                       (__normal_iterator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*const_*,_std::vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*>_>_>
                        *)&textureType);
    if (!bVar6) break;
    ppSVar10 = __gnu_cxx::
               __normal_iterator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*const_*,_std::vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*>_>_>
               ::operator*(&local_50);
    this_00 = *ppSVar10;
    p_Var2 = pFStack_18->texParameteriv;
    GVar7 = TextureFilterMinmaxUtils::SupportedTextureType::getType(this_00);
    (*p_Var2)(GVar7,0x9366,(GLint *)((long)&renderContext + 4));
    GVar7 = (*pFStack_18->getError)();
    glu::checkError(GVar7,"texParameteriv error occurred",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                    ,0x259);
    p_Var3 = pFStack_18->texParameterIiv;
    GVar7 = TextureFilterMinmaxUtils::SupportedTextureType::getType(this_00);
    (*p_Var3)(GVar7,0x9366,(GLint *)((long)&renderContext + 4));
    GVar7 = (*pFStack_18->getError)();
    glu::checkError(GVar7,"texParameterIiv error occurred",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                    ,0x25c);
    __gnu_cxx::
    __normal_iterator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*const_*,_std::vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*>_>_>
    ::operator++(&local_50);
  }
  this_03 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  iter_1._M_current._7_1_ =
       glu::ContextInfo::isExtensionSupported(this_03,"GL_ARB_ES3_1_compatibility");
  pvVar11 = TextureFilterMinmaxUtils::getSupportedTextureDataTypes(&this->m_utils);
  local_70._M_current =
       (SupportedTextureDataType *)
       std::
       vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>
       ::begin(pvVar11);
  while( true ) {
    pvVar11 = TextureFilterMinmaxUtils::getSupportedTextureDataTypes(&this->m_utils);
    texture.super_UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>.m_data._8_8_ =
         std::
         vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>
         ::end(pvVar11);
    bVar6 = __gnu_cxx::operator!=
                      (&local_70,
                       (__normal_iterator<const_gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType_*,_std::vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>_>
                        *)&texture.
                           super_UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>.
                           m_data.field_0x8);
    if (!bVar6) break;
    pSVar12 = __gnu_cxx::
              __normal_iterator<const_gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType_*,_std::vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>_>
              ::operator->(&local_70);
    bVar6 = TextureFilterMinmaxUtils::SupportedTextureDataType::hasFlag(pSVar12,COMPATIBILITY);
    if ((!bVar6) || ((iter_1._M_current._7_1_ & 1) != 0)) {
      pTVar13 = (Texture2D *)operator_new(0x70);
      context = sampler.
                super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)7>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)7>_>_>
                .m_data._8_8_;
      pSVar12 = __gnu_cxx::
                __normal_iterator<const_gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType_*,_std::vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>_>
                ::operator->(&local_70);
      dVar8 = pSVar12->m_format;
      pSVar12 = __gnu_cxx::
                __normal_iterator<const_gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType_*,_std::vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>_>
                ::operator->(&local_70);
      glu::Texture2D::Texture2D(pTVar13,(RenderContext *)context,dVar8,pSVar12->m_type,0x20,0x20);
      de::DefaultDeleter<glu::Texture2D>::DefaultDeleter(&local_89);
      de::details::MovePtr<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>::MovePtr
                ((MovePtr<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_> *)local_88,pTVar13);
      pTVar13 = de::details::UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>::
                operator->((UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_> *)
                           local_88);
      (*pTVar13->_vptr_Texture2D[2])();
      GVar7 = (*pFStack_18->getError)();
      glu::checkError(GVar7,"glu::Texture2D error occurred",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                      ,0x26a);
      p_Var4 = pFStack_18->textureParameteriv;
      pTVar13 = de::details::UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>::
                operator->((UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_> *)
                           local_88);
      dVar8 = glu::Texture2D::getGLTexture(pTVar13);
      (*p_Var4)(dVar8,0x9366,(GLint *)((long)&renderContext + 4));
      GVar7 = (*pFStack_18->getError)();
      glu::checkError(GVar7,"textureParameteriv error occurred",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                      ,0x26d);
      p_Var5 = pFStack_18->textureParameterIiv;
      pTVar13 = de::details::UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>::
                operator->((UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_> *)
                           local_88);
      dVar8 = glu::Texture2D::getGLTexture(pTVar13);
      (*p_Var5)(dVar8,0x9366,(GLint *)((long)&renderContext + 4));
      GVar7 = (*pFStack_18->getError)();
      glu::checkError(GVar7,"textureParameterIiv error occurred",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                      ,0x270);
      de::details::MovePtr<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>::~MovePtr
                ((MovePtr<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_> *)local_88);
    }
    __gnu_cxx::
    __normal_iterator<const_gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType_*,_std::vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>_>
    ::operator++(&local_70);
  }
  de::details::
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)7>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)7>_>_>
  ::~MovePtr((MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)7>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)7>_>_>
              *)local_38);
  return;
}

Assistant:

void TextureFilterMinmaxParameterQueriesTestCase::testReductionModeQueries(const glw::Functions& gl, glw::GLint pname)
{
	const glu::RenderContext& renderContext = m_context.getRenderContext();
	de::MovePtr<glu::Sampler> sampler		= de::MovePtr<glu::Sampler>(new glu::Sampler(renderContext));
	GLU_EXPECT_NO_ERROR(gl.getError(), "glu::Sampler error occurred");

	gl.samplerParameteri(**sampler, GL_TEXTURE_REDUCTION_MODE_ARB, pname);
	GLU_EXPECT_NO_ERROR(gl.getError(), "samplerParameteri error occurred");

	for (TextureFilterMinmaxUtils::SupportedTextureTypeIter iter = m_utils.getSupportedTextureTypes().begin();
		 iter != m_utils.getSupportedTextureTypes().end(); ++iter)
	{
		TextureFilterMinmaxUtils::SupportedTextureType* textureType = *iter;

		gl.texParameteriv(textureType->getType(), GL_TEXTURE_REDUCTION_MODE_ARB, &pname);
		GLU_EXPECT_NO_ERROR(gl.getError(), "texParameteriv error occurred");

		gl.texParameterIiv(textureType->getType(), GL_TEXTURE_REDUCTION_MODE_ARB, &pname);
		GLU_EXPECT_NO_ERROR(gl.getError(), "texParameterIiv error occurred");
	}

	bool is_arb_es31_compatibility = m_context.getContextInfo().isExtensionSupported("GL_ARB_ES3_1_compatibility");

	for (TextureFilterMinmaxUtils::SupportedTextureDataTypeIter iter = m_utils.getSupportedTextureDataTypes().begin();
		 iter != m_utils.getSupportedTextureDataTypes().end(); ++iter)
	{
		if (iter->hasFlag(TextureFilterMinmaxUtils::COMPATIBILITY) && !is_arb_es31_compatibility)
			continue;

		de::MovePtr<glu::Texture2D> texture = de::MovePtr<glu::Texture2D>(new glu::Texture2D(
			renderContext, iter->m_format, iter->m_type, TEXTURE_FILTER_MINMAX_SIZE, TEXTURE_FILTER_MINMAX_SIZE));
		texture->upload();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glu::Texture2D error occurred");

		gl.textureParameteriv(texture->getGLTexture(), GL_TEXTURE_REDUCTION_MODE_ARB, &pname);
		GLU_EXPECT_NO_ERROR(gl.getError(), "textureParameteriv error occurred");

		gl.textureParameterIiv(texture->getGLTexture(), GL_TEXTURE_REDUCTION_MODE_ARB, &pname);
		GLU_EXPECT_NO_ERROR(gl.getError(), "textureParameterIiv error occurred");
	}
}